

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O0

int __thiscall sai::ifstreambuf::open(ifstreambuf *this,char *__file,int __oflag,...)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode __mode;
  ulong uVar3;
  int __fd;
  __mbstate_t __s;
  undefined1 auVar4 [16];
  fpos<__mbstate_t> local_40;
  undefined8 local_30;
  pos_type FileSize;
  path *Path_local;
  ifstreambuf *this_local;
  
  FileSize._M_state = (__mbstate_t)__file;
  bVar1 = is_open(this);
  __s = FileSize._M_state;
  if (bVar1) {
    this_local = (ifstreambuf *)0x0;
  }
  else {
    __mode = std::operator|(_S_bin,_S_ate);
    std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
              (&this->FileIn,(path *)__s,__mode);
    __fd = __s.__count;
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      close(this,__fd);
      this_local = (ifstreambuf *)0x0;
    }
    else {
      auVar4 = std::istream::tellg();
      FileSize._M_off = auVar4._8_8_;
      local_30 = auVar4._0_8_;
      uVar3 = std::fpos::operator_cast_to_long((fpos *)&local_30);
      if ((uVar3 & 0xfff) == 0) {
        uVar3 = std::fpos::operator_cast_to_long((fpos *)&local_30);
        this->PageCount = (uint32_t)((uVar3 & 0xffffffff) >> 0xc);
        std::fpos<__mbstate_t>::fpos(&local_40,0);
        (**(code **)(*(long *)this + 0x28))(this,local_40._M_off,local_40._M_state,8);
        this_local = this;
      }
      else {
        close(this,__fd);
        this_local = (ifstreambuf *)0x0;
      }
    }
  }
  return (int)this_local;
}

Assistant:

ifstreambuf* ifstreambuf::open(const std::filesystem::path& Path)
{
	if( is_open() == true )
	{
		return nullptr;
	}

	FileIn.open(Path, std::ios::binary | std::ios::ate);

	if( FileIn.is_open() == false )
	{
		close();
		return nullptr;
	}

	const std::ifstream::pos_type FileSize = FileIn.tellg();

	if( FileSize % VirtualPage::PageSize != 0 )
	{
		// File size is not pagealigned
		close();
		return nullptr;
	}

	PageCount = static_cast<std::uint32_t>(FileSize) / VirtualPage::PageSize;

	seekpos(0);

	return this;
}